

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O1

void char_callback(GLFWwindow *window,uint codepoint)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  uVar1 = counter;
  counter = counter + 1;
  dVar4 = glfwGetTime();
  iVar2 = wctomb((char *)&get_character_string_result,codepoint);
  iVar3 = 0;
  if (iVar2 != -1) {
    iVar3 = iVar2;
  }
  *(undefined1 *)((long)&get_character_string_result + (long)iVar3) = 0;
  printf("%08x at %0.3f: Character 0x%08x (%s) input\n",dVar4,(ulong)uVar1,codepoint,
         &get_character_string_result);
  return;
}

Assistant:

static void char_callback(GLFWwindow* window, unsigned int codepoint)
{
    printf("%08x at %0.3f: Character 0x%08x (%s) input\n",
           counter++,
           glfwGetTime(),
           codepoint,
           get_character_string(codepoint));
}